

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O1

int MergeRopeChunksProc(size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
                       Col_ClientData clientData)

{
  Col_StringFormat CVar1;
  Col_StringFormat CVar2;
  void *pvVar3;
  sbyte sVar4;
  long lVar5;
  undefined4 uVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  
  lVar5 = *(long *)((long)clientData + 0x68);
  if (lVar5 == 0) {
    *(Col_StringFormat *)clientData = chunks->format;
  }
  CVar1 = *clientData;
  CVar2 = chunks->format;
  if (CVar1 - COL_UTF8 < 2) {
    if (CVar2 != CVar1) {
      return -1;
    }
    lVar5 = *(long *)((long)clientData + 0x70);
    sVar7 = chunks->byteLength;
    if (0x5a < sVar7 + lVar5) {
      return -1;
    }
  }
  else {
    if (CVar2 - COL_UTF8 < 2) {
      return -1;
    }
    if ((CVar1 & (COL_UCS4|COL_UCS2|COL_UCS1)) < (CVar2 & (COL_UCS4|COL_UCS2|COL_UCS1))) {
      uVar8 = (lVar5 + length) * (ulong)(CVar2 & (COL_UCS4|COL_UCS2|COL_UCS1));
    }
    else {
      uVar8 = (CVar1 & (COL_UCS4|COL_UCS2|COL_UCS1)) * length + *(long *)((long)clientData + 0x70);
    }
    if (0x5c < uVar8) {
      return -1;
    }
    if (CVar1 == COL_UCS4) {
      if (CVar2 == COL_UCS1) {
        if (length != 0) {
          pvVar3 = chunks->data;
          lVar9 = *(long *)((long)clientData + 0x70);
          sVar7 = 0;
          do {
            *(uint *)((long)clientData + sVar7 * 4 + lVar9 + 4) =
                 (uint)*(byte *)((long)pvVar3 + sVar7);
            sVar7 = sVar7 + 1;
          } while (length != sVar7);
        }
      }
      else {
        if (CVar2 != COL_UCS2) goto LAB_0010b9e6;
        if (length != 0) {
          pvVar3 = chunks->data;
          lVar9 = *(long *)((long)clientData + 0x70);
          sVar7 = 0;
          do {
            *(uint *)((long)clientData + sVar7 * 4 + lVar9 + 4) =
                 (uint)*(ushort *)((long)pvVar3 + sVar7 * 2);
            sVar7 = sVar7 + 1;
          } while (length != sVar7);
        }
      }
      *(size_t *)((long)clientData + 0x68) = lVar5 + length;
      sVar7 = length << 2;
      goto LAB_0010ba18;
    }
    if (CVar1 == COL_UCS2) {
      if (CVar2 == COL_UCS1) {
        if (length != 0) {
          pvVar3 = chunks->data;
          lVar9 = *(long *)((long)clientData + 0x70);
          sVar7 = 0;
          do {
            *(ushort *)((long)clientData + sVar7 * 2 + lVar9 + 4) =
                 (ushort)*(byte *)((long)pvVar3 + sVar7);
            sVar7 = sVar7 + 1;
          } while (length != sVar7);
        }
        *(size_t *)((long)clientData + 0x68) = lVar5 + length;
        sVar7 = length * 2;
        goto LAB_0010ba18;
      }
      if (CVar2 == COL_UCS4) {
        uVar6 = 4;
        sVar4 = 2;
        for (lVar9 = lVar5; lVar9 != 0; lVar9 = lVar9 + -1) {
          *(uint *)((long)clientData + lVar9 * 4) =
               (uint)*(ushort *)((long)clientData + lVar9 * 2 + 2);
        }
        goto LAB_0010b9dc;
      }
    }
    else if (CVar1 == COL_UCS1) {
      if (CVar2 == COL_UCS2) {
        uVar6 = 2;
        sVar4 = 1;
        for (lVar9 = lVar5; lVar9 != 0; lVar9 = lVar9 + -1) {
          *(short *)((long)clientData + lVar9 * 2 + 2) =
               (short)*(char *)((long)clientData + lVar9 + 3);
        }
      }
      else {
        if (CVar2 != COL_UCS4) goto LAB_0010b9e6;
        uVar6 = 4;
        sVar4 = 2;
        for (lVar9 = lVar5; lVar9 != 0; lVar9 = lVar9 + -1) {
          *(int *)((long)clientData + lVar9 * 4) = (int)*(char *)((long)clientData + lVar9 + 3);
        }
      }
LAB_0010b9dc:
      *(long *)((long)clientData + 0x70) = lVar5 << sVar4;
      *(undefined4 *)clientData = uVar6;
    }
LAB_0010b9e6:
    lVar5 = *(long *)((long)clientData + 0x70);
    sVar7 = chunks->byteLength;
    if (0x5c < sVar7 + lVar5) {
      return -1;
    }
  }
  memcpy((void *)((long)clientData + lVar5 + 4),chunks->data,sVar7);
  *(long *)((long)clientData + 0x68) = *(long *)((long)clientData + 0x68) + length;
  sVar7 = chunks->byteLength;
LAB_0010ba18:
  *(long *)((long)clientData + 0x70) = *(long *)((long)clientData + 0x70) + sVar7;
  return 0;
}

Assistant:

static int
MergeRopeChunksProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to #MergeRopeChunksInfo. */
    Col_ClientData clientData)
{
    MergeRopeChunksInfo *info = (MergeRopeChunksInfo *) clientData;

    ASSERT(number == 1);
    if (info->length == 0) {
        info->format = chunks->format;
    }
    if (info->format == COL_UTF8 || info->format == COL_UTF16) {
        if (chunks->format != info->format) {
            /*
             * Don't merge UTF-8/16 with other formats.
             */

            return -1;
        }
        if (info->byteLength + chunks->byteLength
                > MAX_SHORT_LEAF_SIZE - UTFSTR_HEADER_SIZE) {
            /*
             * Data won't fit.
             */

            return -1;
        }

        /*
         * Append data.
         */

        memcpy(info->data+info->byteLength, chunks->data, chunks->byteLength);
        info->length += length;
        info->byteLength += chunks->byteLength;
        return 0;
    } else {
        size_t index;           /* For upconversions. */

        if (chunks->format == COL_UTF8 || chunks->format == COL_UTF16) {
            /*
             * Don't merge UTF-8/16 with fixed-width formats.
             */

            return -1;
        }

        /*
         * Convert and append data if needed. Conversion of existing data is
         * done in-place, so iterate backwards.
         */

        if (CHAR_WIDTH(info->format) >= CHAR_WIDTH(chunks->format)) {
            /*
             * Appended data will be upconverted.
             */

            if (info->byteLength + (length * CHAR_WIDTH(info->format))
                    > MAX_SHORT_LEAF_SIZE - UCSSTR_HEADER_SIZE) {
                /*
                 * Data won't fit.
                 */

                return -1;
            }
        } else {
            /*
             * Existing data will be upconverted.
             */

            if ((info->length + length) * CHAR_WIDTH(chunks->format)
                    > MAX_SHORT_LEAF_SIZE - UCSSTR_HEADER_SIZE) {
                /*
                 * Data won't fit.
                 */

                return -1;
            }
        }
        switch (info->format) {
        case COL_UCS1:
            switch (chunks->format) {
            case COL_UCS2:
                /*
                 * Upconvert existing data to UCS-2.
                 */

                for (index = info->length-1; index != -1; index--) {
                    ((Col_Char2 *) info->data)[index] = info->data[index];
                }
                info->byteLength = info->length*sizeof(Col_Char2);
                info->format = COL_UCS2;
                break;

            case COL_UCS4:
                /*
                 * Upconvert existing data to UCS-4.
                 */

                for (index = info->length-1; index != -1; index--) {
                    ((Col_Char4 *) info->data)[index] = info->data[index];
                }
                info->byteLength = info->length * sizeof(Col_Char4);
                info->format = COL_UCS4;
                break;
            }
            break;

        case COL_UCS2:
            switch (chunks->format) {
            case COL_UCS1:
                /*
                 * Append data and return, upconverting in the process.
                 */

                for (index = 0; index < length; index++) {
                    ((Col_Char2 *) (info->data+info->byteLength))[index]
                            = ((Col_Char1 *) chunks->data)[index];
                }
                info->length += length;
                info->byteLength += length*sizeof(Col_Char2);
                return 0;

            case COL_UCS4:
                /*
                 Upconvert existing data to UCS-4.
                 */

                for (index = info->length-1; index != -1; index--) {
                    ((Col_Char4 *) info->data)[index]
                            = ((Col_Char2 *) info->data)[index];
                }
                info->byteLength = info->length * sizeof(Col_Char4);
                info->format = COL_UCS4;
                break;
            }
            break;

        case COL_UCS4:
            switch (chunks->format) {
            case COL_UCS1:
                /*
                 * Append data and return, upconverting in the process.
                 */

                for (index = 0; index < length; index++) {
                    ((Col_Char4 *) (info->data+info->byteLength))[index]
                            = ((Col_Char1 *) chunks->data)[index];
                }
                info->length += length;
                info->byteLength += length*sizeof(Col_Char4);
                return 0;

            case COL_UCS2:
                /*
                 * Append data and return, upconverting in the process.
                 */

                for (index = 0; index < length; index++) {
                    ((Col_Char4 *) (info->data+info->byteLength))[index]
                            = ((Col_Char2 *) chunks->data)[index];
                }
                info->length += length;
                info->byteLength += length*sizeof(Col_Char4);
                return 0;
            }
            break;
        }

        ASSERT(info->format == chunks->format);

        if (info->byteLength + chunks->byteLength
                > MAX_SHORT_LEAF_SIZE - UCSSTR_HEADER_SIZE) {
            /*
             * Data won't fit.
             */

            return -1;
        }

        /*
         * Append data.
         */

        memcpy(info->data+info->byteLength, chunks->data, chunks->byteLength);
        info->length += length;
        info->byteLength += chunks->byteLength;
        return 0;
    }
}